

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_time(parser *p)

{
  void *pvVar1;
  object_kind *poVar2;
  random_conflict rVar3;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  object_kind *k;
  artifact *a;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    poVar2 = lookup_kind(*(wchar_t *)((long)pvVar1 + 0x20),*(wchar_t *)((long)pvVar1 + 0x24));
    if ((*(int *)((long)pvVar1 + 0x20) == 0x13) && ((uint)z_info->ordinary_kind_max <= poVar2->kidx)
       ) {
      rVar3 = parser_getrand(p,"time");
      local_38 = rVar3._0_8_;
      (poVar2->time).base = (undefined4)local_38;
      (poVar2->time).dice = local_38._4_4_;
      local_30 = rVar3._8_8_;
      (poVar2->time).sides = (undefined4)local_30;
      (poVar2->time).m_bonus = local_30._4_4_;
    }
    else {
      rVar3 = parser_getrand(p,"time");
      local_48 = rVar3._0_8_;
      *(undefined8 *)((long)pvVar1 + 0x130) = local_48;
      local_40 = rVar3._8_8_;
      *(undefined8 *)((long)pvVar1 + 0x138) = local_40;
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_time(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct object_kind *k;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Special light activations are a property of the base object */
	k = lookup_kind(a->tval, a->sval);
	if ((a->tval == TV_LIGHT) && (k->kidx >= z_info->ordinary_kind_max)) {
		k->time = parser_getrand(p, "time");
	} else {
		a->time = parser_getrand(p, "time");
	}
	return PARSE_ERROR_NONE;
}